

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintCharAndCodeTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  char *pcVar1;
  CharFormat CVar2;
  size_t sVar3;
  char *local_30 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"L\'",2);
  CVar2 = PrintAsCharLiteralTo<wchar_t,wchar_t>(c,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  if (c != L'\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    String::Format((char *)local_30,"%d",c);
    pcVar1 = local_30[0];
    if (local_30[0] == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar3 = strlen(local_30[0]);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
      operator_delete__(pcVar1);
    }
    if ((9 < (uint)c) && (CVar2 != kHexEscape)) {
      String::Format((char *)local_30,", 0x%X",c);
      if (local_30[0] == (char *)0x0) {
        std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
      }
      else {
        sVar3 = strlen(local_30[0]);
        std::__ostream_insert<char,std::char_traits<char>>(os,local_30[0],sVar3);
        operator_delete__(local_30[0]);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
    return;
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << String::Format("%d", c).c_str();

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << String::Format(", 0x%X",
                          static_cast<UnsignedChar>(c)).c_str();
  }
  *os << ")";
}